

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode
UA_Session_deleteSubscription(UA_Server *server,UA_Session *session,UA_UInt32 subscriptionID)

{
  UA_Subscription *subscription;
  UA_Subscription *sub;
  UA_UInt32 subscriptionID_local;
  UA_Session *session_local;
  UA_Server *server_local;
  
  subscription = UA_Session_getSubscriptionByID(session,subscriptionID);
  if (subscription == (UA_Subscription *)0x0) {
    server_local._4_4_ = 0x80280000;
  }
  else {
    if ((subscription->listEntry).le_next != (UA_Subscription *)0x0) {
      (((subscription->listEntry).le_next)->listEntry).le_prev = (subscription->listEntry).le_prev;
    }
    *(subscription->listEntry).le_prev = (subscription->listEntry).le_next;
    UA_Subscription_deleteMembers(subscription,server);
    free(subscription);
    server_local._4_4_ = 0;
  }
  return server_local._4_4_;
}

Assistant:

UA_StatusCode
UA_Session_deleteSubscription(UA_Server *server, UA_Session *session,
                              UA_UInt32 subscriptionID) {
    UA_Subscription *sub = UA_Session_getSubscriptionByID(session, subscriptionID);
    if(!sub)
        return UA_STATUSCODE_BADSUBSCRIPTIONIDINVALID;
    LIST_REMOVE(sub, listEntry);
    UA_Subscription_deleteMembers(sub, server);
    UA_free(sub);
    return UA_STATUSCODE_GOOD;
}